

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap_io.c
# Opt level: O1

ALLEGRO_BITMAP * al_load_bitmap_flags(char *filename,int flags)

{
  _Bool _Var1;
  char *pcVar2;
  Handler *pHVar3;
  ALLEGRO_BITMAP *pAVar4;
  
  pcVar2 = al_identify_bitmap(filename);
  if ((pcVar2 == (char *)0x0) && (pcVar2 = strrchr(filename,0x2e), pcVar2 == (char *)0x0)) {
    _Var1 = _al_trace_prefix("bitmap",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap_io.c"
                             ,200,"al_load_bitmap_flags");
    if (_Var1) {
      pcVar2 = "Could not identify bitmap %s!";
LAB_001428ea:
      _al_trace_suffix(pcVar2,filename);
      return (ALLEGRO_BITMAP *)0x0;
    }
  }
  else {
    pHVar3 = find_handler(pcVar2,false);
    if ((pHVar3 == (Handler *)0x0) || (pHVar3->loader == (ALLEGRO_IIO_LOADER_FUNCTION)0x0)) {
      _Var1 = _al_trace_prefix("bitmap",3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap_io.c"
                               ,0xd5,"al_load_bitmap_flags");
      if (_Var1) {
        pcVar2 = "No handler for bitmap %s!";
        goto LAB_001428ea;
      }
    }
    else {
      pAVar4 = (*pHVar3->loader)(filename,flags);
      if (pAVar4 != (ALLEGRO_BITMAP *)0x0) {
        return pAVar4;
      }
      _Var1 = _al_trace_prefix("bitmap",3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap_io.c"
                               ,0xd1,"al_load_bitmap_flags");
      if (_Var1) {
        _al_trace_suffix("Failed loading bitmap %s with %s handler.\n",filename,pcVar2);
        return (ALLEGRO_BITMAP *)0x0;
      }
    }
  }
  return (ALLEGRO_BITMAP *)0x0;
}

Assistant:

ALLEGRO_BITMAP *al_load_bitmap_flags(const char *filename, int flags)
{
   const char *ext;
   Handler *h;
   ALLEGRO_BITMAP *ret;

   ext = al_identify_bitmap(filename);
   if (!ext) {
      ext = strrchr(filename, '.');
      if (!ext) {
         ALLEGRO_ERROR("Could not identify bitmap %s!", filename);
         return NULL;
      }
   }

   h = find_handler(ext, false);
   if (h && h->loader) {
      ret = h->loader(filename, flags);
      if (!ret)
         ALLEGRO_ERROR("Failed loading bitmap %s with %s handler.\n",
            filename, ext);
   }
   else {
      ALLEGRO_ERROR("No handler for bitmap %s!", filename);
      ret = NULL;
   }

   return ret;
}